

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqTable.cpp
# Opt level: O2

void __thiscall
FreqTable::FreqTable
          (FreqTable *this,string2stringVec *motif,string *seq,int start,bool normalized,
          int codewordLen,unordered_map<string,_char2double> *pDict)

{
  ProbabilityEval::ProbabilityEval
            (&this->super_ProbabilityEval,seq,motif,start,normalized,codewordLen,pDict);
  this->wordEnd = 0;
  (this->cumulative).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cumulative).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->cumulative).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->cumulative).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->start = start;
  (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->codewordLen = (uint8_t)codewordLen;
  return;
}

Assistant:

FreqTable::FreqTable(string2stringVec& motif, string seq,
                     int start, bool normalized, int codewordLen,
                     robin_hood::unordered_map<string, char2double>& pDict):
                     ProbabilityEval(seq, motif, start, normalized,
                                     codewordLen, &pDict),

    wordEnd(0),
    start(start),
    codewordLen(codewordLen)
    {}